

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O2

void dic_reinsert_when_resizing(dictionary *dic,keynode *k2)

{
  keynode **ppkVar1;
  uint32_t uVar2;
  uint uVar3;
  
  uVar2 = meiyan(k2->key,(uint)k2->len);
  uVar3 = uVar2 % (uint)dic->length;
  ppkVar1 = dic->table;
  if (ppkVar1[(int)uVar3] == (keynode *)0x0) {
    ppkVar1[(int)uVar3] = k2;
    k2 = dic->table[(int)uVar3];
  }
  else {
    k2->next = ppkVar1[(int)uVar3];
    ppkVar1[(int)uVar3] = k2;
  }
  dic->value = &k2->value;
  return;
}

Assistant:

void dic_reinsert_when_resizing(struct dictionary* dic, struct keynode *k2) {
	int n = hash_func(k2->key, k2->len) % dic->length;
	if (dic->table[n] == 0) {
		dic->table[n] = k2;
		dic->value = &dic->table[n]->value;
		return;
	}
	struct keynode *k = dic->table[n];
	k2->next = k;
	dic->table[n] = k2;
	dic->value = &k2->value;
}